

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool do_zpz_ptr(DisasContext_conflict1 *s,int rd,int rn,int pg,_Bool is_fp16,undefined1 *fn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint32_t oprsz;
  uint32_t dofs;
  uint32_t aofs;
  uint32_t bofs;
  TCGv_ptr ptr;
  TCGv_ptr status;
  uint vsz;
  TCGContext_conflict1 *tcg_ctx;
  undefined1 *fn_local;
  _Bool is_fp16_local;
  int pg_local;
  int rn_local;
  int rd_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    oprsz = vec_full_reg_size(s);
    ptr = get_fpstatus_ptr_aarch64(tcg_ctx_00,is_fp16);
    dofs = vec_full_reg_offset(s,rd);
    aofs = vec_full_reg_offset(s,rn);
    bofs = pred_full_reg_offset(s,pg);
    tcg_gen_gvec_3_ptr_aarch64(tcg_ctx_00,dofs,aofs,bofs,ptr,oprsz,oprsz,0,fn);
    tcg_temp_free_ptr(tcg_ctx_00,ptr);
  }
  return true;
}

Assistant:

static bool do_zpz_ptr(DisasContext *s, int rd, int rn, int pg,
                       bool is_fp16, gen_helper_gvec_3_ptr *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        TCGv_ptr status = get_fpstatus_ptr(tcg_ctx, is_fp16);
        tcg_gen_gvec_3_ptr(tcg_ctx, vec_full_reg_offset(s, rd),
                           vec_full_reg_offset(s, rn),
                           pred_full_reg_offset(s, pg),
                           status, vsz, vsz, 0, fn);
        tcg_temp_free_ptr(tcg_ctx, status);
    }
    return true;
}